

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O2

shared_ptr<kratos::FunctionCallStmt> *
kratos::FSM::get_func_call_stmt
          (shared_ptr<kratos::FunctionStmtBlock> *func_def,FSMState *fsm_state,
          shared_ptr<kratos::FunctionCallStmt> *func_stmt)

{
  size_t *__return_storage_ptr__;
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
  mapping;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68 [3];
  __shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> local_50 [8];
  shared_ptr<kratos::Var> var_to_;
  
  mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&mapping;
  mapping._M_t._M_impl._0_4_ = 0;
  mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  mapping._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  __return_storage_ptr__ = &mapping._M_t._M_impl.super__Rb_tree_header._M_node_count;
  mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  var_to_.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)func_def;
  for (p_Var1 = (fsm_state->output_values_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(fsm_state->output_values_)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    p_Var2 = p_Var1[1]._M_parent;
    if (p_Var2 == (_Base_ptr)0x0) {
      p_Var2 = *(_Base_ptr *)(p_Var1 + 1);
    }
    std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
              (local_50,(__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)&p_Var2[3]._M_parent)
    ;
    (**(code **)(**(long **)(p_Var1 + 1) + 0xf8))(&local_c0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__,&local_c0,"_value");
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
    ::_M_emplace_unique<std::__cxx11::string,std::shared_ptr<kratos::Var>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
                *)local_a0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,(shared_ptr<kratos::Var> *)local_50);
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&var_to_);
  }
  std::
  make_shared<kratos::FunctionCallStmt,std::shared_ptr<kratos::FunctionStmtBlock>const&,std::map<std::__cxx11::string,std::shared_ptr<kratos::Var>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>&>
            ((shared_ptr<kratos::FunctionStmtBlock> *)
             &mapping._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
              *)var_to_.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi);
  std::__shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&func_stmt->super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2> *)
             &mapping._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_68);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
               *)local_a0);
  return func_stmt;
}

Assistant:

std::shared_ptr<FunctionCallStmt>& FSM::get_func_call_stmt(
    const std::shared_ptr<FunctionStmtBlock>& func_def, const FSMState* fsm_state,
    std::shared_ptr<FunctionCallStmt>& func_stmt) {
    // get arg mapping
    std::map<std::string, std::shared_ptr<Var>> mapping;
    auto const& output_values = fsm_state->output_values();
    for (auto const& [var_from, var_to] : output_values) {
        std::shared_ptr<Var> var_to_ =
            var_to ? var_to->shared_from_this() : var_from->shared_from_this();
        mapping.emplace(var_from->to_string() + "_value", var_to_);
    }
    func_stmt = std::make_shared<FunctionCallStmt>(func_def, mapping);
    return func_stmt;
}